

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O1

void __thiscall wasm::ReferenceFinder::noteRefFunc(ReferenceFinder *this,Name refFunc)

{
  pointer *ppNVar1;
  iterator __position;
  undefined1 auStack_18 [8];
  Name refFunc_local;
  
  refFunc_local.super_IString.str._M_len = refFunc.super_IString.str._M_str;
  auStack_18 = refFunc.super_IString.str._M_len;
  __position._M_current =
       (this->refFuncs).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->refFuncs).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->refFuncs,__position,
               (Name *)auStack_18);
  }
  else {
    ((__position._M_current)->super_IString).str._M_len = (size_t)auStack_18;
    ((__position._M_current)->super_IString).str._M_str =
         (char *)refFunc_local.super_IString.str._M_len;
    ppNVar1 = &(this->refFuncs).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  return;
}

Assistant:

void noteRefFunc(Name refFunc) { refFuncs.push_back(refFunc); }